

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddFile
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,
          FileDescriptorProto *file,FileDescriptorProto *value)

{
  int iVar1;
  string *psVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  LogMessage *pLVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  Type *pTVar10;
  int iVar11;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  FileDescriptorProto *local_78;
  undefined1 local_70 [56];
  RepeatedPtrFieldBase *local_38;
  
  local_78 = value;
  bVar4 = InsertIfNotPresent<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>>
                    (&this->by_name_,(file->name_).ptr_,&local_78);
  if (!bVar4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_70,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x39);
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)local_70,"File already exists in database: ");
    pLVar6 = internal::LogMessage::operator<<(pLVar6,(file->name_).ptr_);
    internal::LogFinisher::operator=((LogFinisher *)&local_98,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)local_70);
    return false;
  }
  if (((file->_has_bits_).has_bits_[0] & 2) == 0) {
    local_70._0_8_ = local_70 + 0x10;
    local_70._8_8_ = (char *)0x0;
    local_70[0x10] = '\0';
  }
  else {
    psVar2 = (file->package_).ptr_;
    local_70._0_8_ = local_70 + 0x10;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar3,pcVar3 + psVar2->_M_string_length);
  }
  if ((char *)local_70._8_8_ != (char *)0x0) {
    std::__cxx11::string::push_back((char)local_70);
  }
  if (0 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar7->name_).ptr_);
      bVar4 = AddSymbol(this,&local_98,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_0030eefa;
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(file->message_type_).super_RepeatedPtrFieldBase,iVar11);
      bVar4 = AddNestedExtensions(this,pTVar7,local_78);
      if (!bVar4) goto LAB_0030eefa;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar8 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(file->enum_type_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar8->name_).ptr_);
      bVar4 = AddSymbol(this,&local_98,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_0030eefa;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (0 < (file->extension_).super_RepeatedPtrFieldBase.current_size_) {
    iVar11 = 0;
    do {
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar11);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar9->name_).ptr_);
      bVar4 = AddSymbol(this,&local_98,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_0030eefa;
      pTVar9 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (&(file->extension_).super_RepeatedPtrFieldBase,iVar11);
      bVar4 = AddExtension(this,pTVar9,local_78);
      if (!bVar4) goto LAB_0030eefa;
      iVar11 = iVar11 + 1;
    } while (iVar11 < (file->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar11 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
  bVar4 = iVar11 < 1;
  if (0 < iVar11) {
    local_38 = &(file->service_).super_RepeatedPtrFieldBase;
    iVar11 = 0;
    do {
      pTVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (local_38,iVar11);
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     (pTVar10->name_).ptr_);
      bVar5 = AddSymbol(this,&local_98,local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) break;
      iVar11 = iVar11 + 1;
      iVar1 = (file->service_).super_RepeatedPtrFieldBase.current_size_;
      bVar4 = iVar1 <= iVar11;
    } while (iVar11 < iVar1);
  }
LAB_0030eefc:
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,CONCAT71(local_70._17_7_,local_70[0x10]) + 1);
  }
  return bVar4;
LAB_0030eefa:
  bVar4 = false;
  goto LAB_0030eefc;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddFile(
    const FileDescriptorProto& file,
    Value value) {
  if (!InsertIfNotPresent(&by_name_, file.name(), value)) {
    GOOGLE_LOG(ERROR) << "File already exists in database: " << file.name();
    return false;
  }

  // We must be careful here -- calling file.package() if file.has_package() is
  // false could access an uninitialized static-storage variable if we are being
  // run at startup time.
  string path = file.has_package() ? file.package() : string();
  if (!path.empty()) path += '.';

  for (int i = 0; i < file.message_type_size(); i++) {
    if (!AddSymbol(path + file.message_type(i).name(), value)) return false;
    if (!AddNestedExtensions(file.message_type(i), value)) return false;
  }
  for (int i = 0; i < file.enum_type_size(); i++) {
    if (!AddSymbol(path + file.enum_type(i).name(), value)) return false;
  }
  for (int i = 0; i < file.extension_size(); i++) {
    if (!AddSymbol(path + file.extension(i).name(), value)) return false;
    if (!AddExtension(file.extension(i), value)) return false;
  }
  for (int i = 0; i < file.service_size(); i++) {
    if (!AddSymbol(path + file.service(i).name(), value)) return false;
  }

  return true;
}